

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::incoming_request_alert::~incoming_request_alert(incoming_request_alert *this)

{
  incoming_request_alert *this_local;
  
  ~incoming_request_alert(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT incoming_request_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT incoming_request_alert(aux::stack_allocator& alloc
			, peer_request r, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id);

		static inline constexpr alert_category_t static_category = alert_category::incoming_request;
		TORRENT_DEFINE_ALERT(incoming_request_alert, 84)

		std::string message() const override;

		// the request this peer sent to us
		peer_request req;
	}